

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setroottable(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQObjectPtr *in_RDI;
  SQObject o;
  SQChar *in_stack_ffffffffffffffd8;
  int iVar2;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  SQRESULT local_8;
  
  pSVar1 = stack_get(in_stack_ffffffffffffffe0,(SQInteger)in_stack_ffffffffffffffd8);
  iVar2 = (int)*(HSQUIRRELVM *)&pSVar1->super_SQObject;
  if ((iVar2 == 0xa000020) || (iVar2 == 0x1000001)) {
    SQObjectPtr::operator=(in_RDI,(SQObject *)(pSVar1->super_SQObject)._unVal.pTable);
    SQVM::Pop((SQVM *)0x11763c);
    local_8 = 0;
  }
  else {
    local_8 = sq_throwerror(*(HSQUIRRELVM *)&pSVar1->super_SQObject,in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

SQRESULT sq_setroottable(HSQUIRRELVM v)
{
    SQObject o = stack_get(v, -1);
    if(sq_istable(o) || sq_isnull(o)) {
        v->_roottable = o;
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("invalid type"));
}